

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitRefIsNull(Struct2Local *this,RefIsNull *curr)

{
  ParentChildInteraction PVar1;
  Drop *left;
  Const *right;
  Block *expression;
  Builder *this_00;
  optional<wasm::Type> type;
  undefined1 local_50 [2] [12];
  Literal local_30;
  RefIsNull *local_18;
  RefIsNull *curr_local;
  Struct2Local *this_local;
  
  local_18 = curr;
  curr_local = (RefIsNull *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    this_00 = &this->builder;
    left = Builder::makeDrop(this_00,(Expression *)local_18);
    wasm::Literal::Literal(&local_30,0);
    right = Builder::makeConst(this_00,&local_30);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_50);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_50[0]._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_50[0][8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_50[0]._9_3_;
    expression = Builder::makeSequence(this_00,(Expression *)left,(Expression *)right,type);
    replaceCurrent(this,(Expression *)expression);
    wasm::Literal::~Literal(&local_30);
  }
  return;
}

Assistant:

void visitRefIsNull(RefIsNull* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // The result must be 0, since the allocation is not null. Drop the RefIs
    // and append that.
    replaceCurrent(builder.makeSequence(
      builder.makeDrop(curr), builder.makeConst(Literal(int32_t(0)))));
  }